

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.hpp
# Opt level: O1

token __thiscall
wigwag::
signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
::connect<std::function<void()>>
          (signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
           *this,function<void_()> *handler,handler_attributes attributes)

{
  long *plVar1;
  code *pcVar2;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  undefined8 *puVar3;
  undefined8 local_48;
  undefined8 uStack_40;
  code *local_38;
  undefined8 local_30;
  
  puVar3 = (undefined8 *)CONCAT44(in_register_00000014,attributes);
  creation::lazy::
  storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>
  ::ensure_created<true>
            ((storage<wigwag::detail::intrusive_ptr<wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>,_wigwag::detail::signal_impl<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::ref_counter::single_threaded>_>
              *)handler);
  plVar1 = *(long **)&(handler->super__Function_base)._M_functor;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = (code *)0x0;
  local_30 = puVar3[3];
  pcVar2 = (code *)puVar3[2];
  if (pcVar2 != (code *)0x0) {
    local_48 = *puVar3;
    uStack_40 = puVar3[1];
    puVar3[2] = 0;
    puVar3[3] = 0;
    local_38 = pcVar2;
  }
  (**(code **)(*plVar1 + 0x10))(this,plVar1,&local_48,in_ECX);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return (token)(implementation *)this;
}

Assistant:

token connect(HandlerFunc_ handler, handler_attributes attributes = handler_attributes::none) const
        { return _impl->connect(std::move(handler), attributes); }